

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void * decodeHex(char *src,int *size)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  int iStack_34;
  char x;
  int v;
  int i;
  char *s;
  uchar *d;
  uchar *data;
  int *size_local;
  char *src_local;
  
  sVar4 = strlen(src);
  *size = (int)((long)((ulong)(uint)((int)sVar4 >> 0x1f) << 0x20 | sVar4 & 0xffffffff) / 2);
  pcVar5 = (char *)malloc((long)*size);
  _v = src;
  s = pcVar5;
  for (iStack_34 = *size; 0 < iStack_34; iStack_34 = iStack_34 + -1) {
    pcVar6 = _v + 1;
    iVar3 = tolower((int)*_v);
    cVar1 = (char)iVar3;
    if (cVar1 < 'a') {
      cVar1 = cVar1 + -0x30;
    }
    else {
      cVar1 = cVar1 + -0x57;
    }
    _v = _v + 2;
    iVar3 = tolower((int)*pcVar6);
    cVar2 = (char)iVar3;
    if (cVar2 < 'a') {
      cVar2 = cVar2 + -0x30;
    }
    else {
      cVar2 = cVar2 + -0x57;
    }
    *s = cVar2 + cVar1 * '\x10';
    s = s + 1;
  }
  return pcVar5;
}

Assistant:

static void *decodeHex( const char *src, int &size ) {
  size = (int) strlen( src )/2;
  unsigned char *data = (unsigned char*)malloc( size ), *d = data;
  const char *s = src;
  for ( int i=size; i>0; i-- ) {
    int v;
    char x = tolower(*s++);
    if ( x >= 'a' ) v = x-'a'+10; else v = x-'0';
    v = v<<4;
    x = tolower(*s++);
    if ( x >= 'a' ) v += x-'a'+10; else v += x-'0';
    *d++ = (uchar)v;
  }
  return (void*)data;
}